

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_boost_suite.cpp
# Opt level: O0

void optional_suite::test_value(void)

{
  iarchive *this;
  bool bVar1;
  reference_type pbVar2;
  char *msg;
  undefined1 local_e0 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  iarchive in;
  value_type input [3];
  
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._6_1_ = 0x41;
  in.reader.stack.c.
  super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node._4_2_ = 0x1a9;
  this = (iarchive *)(value.super_type.m_storage.dummy_.data + 0x18);
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[3]>
            (this,(uchar (*) [3])
                  ((long)&in.reader.stack.c.
                          super__Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                          ._M_impl.super__Deque_impl_data + 0x4c));
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_e0);
  boost::archive::detail::interface_iarchive<trial::protocol::bintoken::iarchive>::operator>>
            ((interface_iarchive<trial::protocol::bintoken::iarchive> *)this,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_e0);
  bVar1 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_e0);
  boost::detail::test_impl
            ("value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_boost_suite.cpp"
             ,0x20,"void optional_suite::test_value()",!bVar1);
  pbVar2 = boost::
           optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_e0);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("*value","\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_boost_suite.cpp"
             ,0x21,"void optional_suite::test_value()",pbVar2,"A");
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_e0);
  trial::protocol::bintoken::iarchive::~iarchive
            ((iarchive *)((long)&value.super_type.m_storage.dummy_ + 0x18));
  return;
}

Assistant:

void test_value()
{
    const value_type input[] = { token::code::string8, 0x01, 'A' };
    format::iarchive in(input);
    boost::optional<std::string> value;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST(value);
    TRIAL_PROTOCOL_TEST_EQUAL(*value, "A");
}